

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# banman.cpp
# Opt level: O1

void __thiscall BanMan::SweepBanned(BanMan *this)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  _Base_ptr p_Var3;
  bool bVar4;
  bool bVar5;
  int64_t iVar6;
  _Base_ptr p_Var7;
  Logger *this_00;
  iterator __position;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  string local_90;
  CSubNet sub_net;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  iVar6 = GetTime();
  __position._M_node = (this->m_banned)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->m_banned)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)__position._M_node != p_Var1) {
    bVar5 = false;
    do {
      prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&sub_net,
                 (prevector<16U,_unsigned_char,_unsigned_int,_int> *)(__position._M_node + 1));
      sub_net.network._24_8_ = __position._M_node[1]._M_right;
      sub_net.valid = *(bool *)&__position._M_node[2]._M_left;
      sub_net.netmask._0_8_ = *(undefined8 *)(__position._M_node + 2);
      sub_net.netmask._8_8_ = __position._M_node[2]._M_parent;
      p_Var3 = __position._M_node[3]._M_parent;
      bVar4 = CSubNet::IsValid(&sub_net);
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
      if (!bVar4 || (long)p_Var3 < iVar6) {
        std::
        _Rb_tree<CSubNet,std::pair<CSubNet_const,CBanEntry>,std::_Select1st<std::pair<CSubNet_const,CBanEntry>>,std::less<CSubNet>,std::allocator<std::pair<CSubNet_const,CBanEntry>>>
        ::erase_abi_cxx11_((_Rb_tree<CSubNet,std::pair<CSubNet_const,CBanEntry>,std::_Select1st<std::pair<CSubNet_const,CBanEntry>>,std::less<CSubNet>,std::allocator<std::pair<CSubNet_const,CBanEntry>>>
                            *)&this->m_banned,__position);
        this->m_is_dirty = true;
        this_00 = LogInstance();
        bVar5 = BCLog::Logger::WillLogCategoryLevel(this_00,NET,Debug);
        if (bVar5) {
          CSubNet::ToString_abi_cxx11_(&local_90,&sub_net);
          logging_function._M_str = "SweepBanned";
          logging_function._M_len = 0xb;
          source_file._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/banman.cpp"
          ;
          source_file._M_len = 0x5a;
          LogPrintFormatInternal<std::__cxx11::string>
                    (logging_function,source_file,0xc4,NET,Debug,(ConstevalFormatString<1U>)0x8297cd
                     ,&local_90);
          bVar5 = true;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          bVar5 = true;
        }
      }
      if (0x10 < sub_net.network.m_addr._size) {
        free(sub_net.network.m_addr._union.indirect_contents.indirect);
        sub_net.network.m_addr._union.indirect_contents.indirect = (char *)0x0;
      }
      __position._M_node = p_Var7;
    } while ((_Rb_tree_header *)p_Var7 != p_Var1);
    if ((bVar5) && (this->m_client_interface != (CClientUIInterface *)0x0)) {
      CClientUIInterface::BannedListChanged(this->m_client_interface);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void BanMan::SweepBanned()
{
    AssertLockHeld(m_banned_mutex);

    int64_t now = GetTime();
    bool notify_ui = false;
    banmap_t::iterator it = m_banned.begin();
    while (it != m_banned.end()) {
        CSubNet sub_net = (*it).first;
        CBanEntry ban_entry = (*it).second;
        if (!sub_net.IsValid() || now > ban_entry.nBanUntil) {
            m_banned.erase(it++);
            m_is_dirty = true;
            notify_ui = true;
            LogDebug(BCLog::NET, "Removed banned node address/subnet: %s\n", sub_net.ToString());
        } else {
            ++it;
        }
    }

    // update UI
    if (notify_ui && m_client_interface) {
        m_client_interface->BannedListChanged();
    }
}